

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeAdvancedBlend(FragmentProcessor *this,BlendEquationAdvanced equation)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  Vec3 *pVVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  Vec3 local_a0;
  Vec3 local_90;
  undefined8 local_84;
  float local_7c;
  undefined1 local_78 [16];
  advblend local_60 [12];
  tcu local_54 [12];
  float local_48;
  
  for (lVar6 = 0; lVar6 != 0x2100; lVar6 = lVar6 + 0x84) {
    if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
        '\x01') {
      fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 0xc)
      ;
      fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 0xc)
      ;
      fVar13 = (1.0 - fVar21) * fVar19;
      fVar18 = (1.0 - fVar19) * fVar21;
      fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6 + 8);
      fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + 8);
      pfVar1 = (float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6);
      uVar2 = *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar6);
      *(ulong *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6) =
           CONCAT44(fVar13 * pfVar1[1] + fVar18 * (float)((ulong)uVar2 >> 0x20),
                    fVar13 * *pfVar1 + fVar18 * (float)uVar2);
      *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8) =
           fVar12 * fVar13 + fVar15 * fVar18;
      *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar6 + -4) =
           fVar19 * fVar21;
      *(float *)((long)this->m_sampleRegister[0].signedValue.m_data + lVar6 + -4) =
           fVar13 + fVar19 * fVar21 + fVar18;
    }
  }
  switch(equation) {
  case BLENDEQUATION_ADVANCED_MULTIPLY:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x5c);
        uVar4 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x3c);
        uVar3 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c);
        *(ulong *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             CONCAT44(fVar19 * (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar2 >> 0x20) +
                      (float)((ulong)uVar3 >> 0x20),
                      fVar19 * (float)uVar4 * (float)uVar2 + (float)uVar3);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar21 * fVar15 * fVar19 + fVar12;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_SCREEN:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x5c);
        fVar13 = (float)uVar2;
        fVar18 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x3c);
        fVar14 = (float)uVar2;
        fVar17 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c);
        *(ulong *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             CONCAT44(fVar19 * ((fVar18 + fVar17) - fVar18 * fVar17) + (float)((ulong)uVar2 >> 0x20)
                      ,fVar19 * ((fVar13 + fVar14) - fVar13 * fVar14) + (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             ((fVar21 + fVar15) - fVar21 * fVar15) * fVar19 + fVar12;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_OVERLAY:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x5c);
        fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x3c);
        if (fVar21 <= 0.5) {
          fVar21 = (fVar19 + fVar19) * fVar21;
        }
        else {
          fVar21 = (1.0 - fVar19) * -2.0 * (1.0 - fVar21) + 1.0;
        }
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x58);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        if (fVar15 <= 0.5) {
          fVar15 = (fVar19 + fVar19) * fVar15;
        }
        else {
          fVar15 = (1.0 - fVar19) * -2.0 * (1.0 - fVar15) + 1.0;
        }
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        if (fVar12 <= 0.5) {
          fVar12 = (fVar19 + fVar19) * fVar12;
        }
        else {
          fVar12 = (1.0 - fVar19) * -2.0 * (1.0 - fVar12) + 1.0;
        }
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x28);
        fVar18 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             fVar21 * fVar19 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             fVar15 * fVar19 + fVar13;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar12 * fVar19 + fVar18;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_DARKEN:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        uVar9 = -(uint)(fVar21 <= fVar15);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x5c);
        fVar13 = (float)uVar2;
        fVar18 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x3c);
        fVar14 = (float)uVar2;
        fVar17 = (float)((ulong)uVar2 >> 0x20);
        uVar10 = -(uint)(fVar13 <= fVar14);
        uVar11 = -(uint)(fVar18 <= fVar17);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c);
        *(ulong *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             CONCAT44(fVar19 * (float)(~uVar11 & (uint)fVar17 | (uint)fVar18 & uVar11) +
                      (float)((ulong)uVar2 >> 0x20),
                      fVar19 * (float)(~uVar10 & (uint)fVar14 | (uint)fVar13 & uVar10) +
                      (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             (float)(~uVar9 & (uint)fVar15 | (uint)fVar21 & uVar9) * fVar19 + fVar12;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_LIGHTEN:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        uVar9 = -(uint)(fVar15 <= fVar21);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x5c);
        fVar13 = (float)uVar2;
        fVar18 = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x3c);
        fVar14 = (float)uVar2;
        fVar17 = (float)((ulong)uVar2 >> 0x20);
        uVar10 = -(uint)(fVar14 <= fVar13);
        uVar11 = -(uint)(fVar17 <= fVar18);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c);
        *(ulong *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             CONCAT44(fVar19 * (float)(~uVar11 & (uint)fVar17 | (uint)fVar18 & uVar11) +
                      (float)((ulong)uVar2 >> 0x20),
                      fVar19 * (float)(~uVar10 & (uint)fVar14 | (uint)fVar13 & uVar10) +
                      (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             (float)(~uVar9 & (uint)fVar15 | (uint)fVar21 & uVar9) * fVar19 + fVar12;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_COLORDODGE:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x3c);
        fVar21 = 0.0;
        if (0.0 < fVar19) {
          fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x5c);
          fVar21 = 1.0;
          if (fVar15 < 1.0) {
            fVar19 = fVar19 / (1.0 - fVar15);
            fVar21 = 1.0;
            if (fVar19 <= 1.0) {
              fVar21 = fVar19;
            }
          }
        }
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        fVar15 = 0.0;
        if (0.0 < fVar19) {
          fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x58);
          fVar15 = 1.0;
          if (fVar12 < 1.0) {
            fVar19 = fVar19 / (1.0 - fVar12);
            fVar15 = 1.0;
            if (fVar19 <= 1.0) {
              fVar15 = fVar19;
            }
          }
        }
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        fVar12 = 0.0;
        if (0.0 < fVar19) {
          fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar6 + -0x54);
          fVar12 = 1.0;
          if (fVar13 < 1.0) {
            fVar19 = fVar19 / (1.0 - fVar13);
            fVar12 = 1.0;
            if (fVar19 <= 1.0) {
              fVar12 = fVar19;
            }
          }
        }
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x28);
        fVar18 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             fVar21 * fVar19 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             fVar15 * fVar19 + fVar13;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar12 * fVar19 + fVar18;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_COLORBURN:
    for (lVar6 = 0; lVar6 != 0x2100; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        local_78 = ZEXT416(*(uint *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data +
                                    lVar6 + -4));
        local_48 = advblend::colorburn(*(float *)((long)this->m_sampleRegister[0].
                                                        clampedBlendSrcColor.m_data + lVar6),
                                       *(float *)((long)this->m_sampleRegister[0].
                                                        clampedBlendDstColor.m_data + lVar6));
        fVar19 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        fVar12 = advblend::colorburn(*(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor
                                                      .m_data + lVar6 + 4),
                                     *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor
                                                      .m_data + lVar6 + 4));
        fVar13 = (float)local_78._0_4_ * local_48;
        fVar12 = (float)local_78._0_4_ * fVar12;
        fVar21 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 4);
        fVar18 = advblend::colorburn(*(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor
                                                      .m_data + lVar6 + 8),
                                     *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor
                                                      .m_data + lVar6 + 8));
        fVar15 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar21 + fVar12,fVar19 + fVar13);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             fVar18 * (float)local_78._0_4_ + fVar15;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_HARDLIGHT:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x5c);
        fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x3c);
        if (fVar19 <= 0.5) {
          fVar21 = (fVar19 + fVar19) * fVar21;
        }
        else {
          fVar21 = (1.0 - fVar19) * -2.0 * (1.0 - fVar21) + 1.0;
        }
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x58);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x38);
        if (fVar19 <= 0.5) {
          fVar15 = (fVar19 + fVar19) * fVar15;
        }
        else {
          fVar15 = (1.0 - fVar19) * -2.0 * (1.0 - fVar15) + 1.0;
        }
        fVar19 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        if (fVar19 <= 0.5) {
          fVar12 = (fVar19 + fVar19) * fVar12;
        }
        else {
          fVar12 = (1.0 - fVar19) * -2.0 * (1.0 - fVar12) + 1.0;
        }
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x28);
        fVar18 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             fVar21 * fVar19 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -8) =
             fVar15 * fVar19 + fVar13;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar12 * fVar19 + fVar18;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_SOFTLIGHT:
    for (lVar6 = 0; lVar6 != 0x2100; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) ==
          '\x01') {
        local_78 = ZEXT416(*(uint *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data +
                                    lVar6 + -4));
        local_48 = advblend::softlight(*(float *)((long)this->m_sampleRegister[0].
                                                        clampedBlendSrcColor.m_data + lVar6),
                                       *(float *)((long)this->m_sampleRegister[0].
                                                        clampedBlendDstColor.m_data + lVar6));
        fVar19 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6);
        fVar12 = advblend::softlight(*(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor
                                                      .m_data + lVar6 + 4),
                                     *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor
                                                      .m_data + lVar6 + 4));
        fVar13 = (float)local_78._0_4_ * local_48;
        fVar12 = (float)local_78._0_4_ * fVar12;
        fVar21 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 4);
        fVar18 = advblend::softlight(*(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor
                                                      .m_data + lVar6 + 8),
                                     *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor
                                                      .m_data + lVar6 + 8));
        fVar15 = *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar6 + 8);
        *(ulong *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6) =
             CONCAT44(fVar21 + fVar12,fVar19 + fVar13);
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar6 + 8) =
             fVar18 * (float)local_78._0_4_ + fVar15;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_DIFFERENCE:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34) -
                 *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar21 = -fVar15;
        if (-fVar15 <= fVar15) {
          fVar21 = fVar15;
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x5c);
        uVar4 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x3c);
        auVar20._0_4_ = (float)uVar4 - (float)uVar2;
        auVar20._4_4_ = (float)((ulong)uVar4 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
        auVar20._8_8_ = 0;
        uVar5 = CONCAT44(auVar20._4_4_,auVar20._0_4_);
        auVar16._0_8_ = uVar5 ^ 0x8000000080000000;
        auVar16._8_4_ = 0x80000000;
        auVar16._12_4_ = 0x80000000;
        auVar16 = maxps(auVar16,auVar20);
        pfVar1 = (float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar6 + -0x2c);
        *(ulong *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             CONCAT44(fVar19 * auVar16._4_4_ + pfVar1[1],fVar19 * auVar16._0_4_ + *pfVar1);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             fVar21 * fVar19 + fVar15;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_EXCLUSION:
    for (lVar6 = 0x5c; lVar6 != 0x215c; lVar6 = lVar6 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar6) == '\x01')
      {
        fVar19 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar6);
        fVar21 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x54);
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x34);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar6 + -0x24);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x5c);
        uVar4 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x3c);
        fVar13 = (float)uVar2;
        fVar18 = (float)((ulong)uVar2 >> 0x20);
        fVar14 = (float)uVar4;
        fVar17 = (float)((ulong)uVar4 >> 0x20);
        uVar2 = *(undefined8 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0x2c);
        *(ulong *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -0xc) =
             CONCAT44(fVar19 * (fVar18 * -2.0 * fVar17 + fVar18 + fVar17) +
                      (float)((ulong)uVar2 >> 0x20),
                      fVar19 * (fVar13 * -2.0 * fVar14 + fVar13 + fVar14) + (float)uVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar6 + -4) =
             (fVar21 * -2.0 * fVar15 + fVar21 + fVar15) * fVar19 + fVar12;
      }
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_HUE:
    pVVar7 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0x40;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      if (*(char *)(pVVar7[-5].m_data + 2) == '\x01') {
        local_90.m_data[2] = ((Vec4 *)(pVVar7 + -4))->m_data[2];
        local_90.m_data._0_8_ = *(undefined8 *)((Vec4 *)(pVVar7 + -4))->m_data;
        local_a0.m_data[2] = *(float *)((long)(pVVar7 + -1) + 4);
        local_a0.m_data._0_8_ = *(undefined8 *)((long)(pVVar7 + -2) + 8);
        fVar19 = pVVar7[1].m_data[0];
        advblend::setLumSat(local_60,&local_90,&local_a0,&local_a0);
        tcu::operator*(local_54,fVar19,(Vector<float,_3> *)local_60);
        tcu::operator+((tcu *)&local_84,(Vector<float,_3> *)local_54,pVVar7);
        *(float *)((long)(pVVar7 + 3) + 4) = local_7c;
        *(undefined8 *)((long)(pVVar7 + 2) + 8) = local_84;
      }
      pVVar7 = pVVar7 + 0xb;
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_SATURATION:
    pVVar7 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0x40;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      if (*(char *)(pVVar7[-5].m_data + 2) == '\x01') {
        local_90.m_data[2] = ((Vec4 *)(pVVar7 + -4))->m_data[2];
        local_90.m_data._0_8_ = *(undefined8 *)((Vec4 *)(pVVar7 + -4))->m_data;
        local_a0.m_data[2] = *(float *)((long)(pVVar7 + -1) + 4);
        local_a0.m_data._0_8_ = *(undefined8 *)((long)(pVVar7 + -2) + 8);
        fVar19 = pVVar7[1].m_data[0];
        advblend::setLumSat(local_60,&local_a0,&local_90,&local_a0);
        tcu::operator*(local_54,fVar19,(Vector<float,_3> *)local_60);
        tcu::operator+((tcu *)&local_84,(Vector<float,_3> *)local_54,pVVar7);
        *(float *)((long)(pVVar7 + 3) + 4) = local_7c;
        *(undefined8 *)((long)(pVVar7 + 2) + 8) = local_84;
      }
      pVVar7 = pVVar7 + 0xb;
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_COLOR:
    pVVar7 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0x40;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      if (*(char *)(pVVar7[-5].m_data + 2) == '\x01') {
        local_90.m_data[2] = ((Vec4 *)(pVVar7 + -4))->m_data[2];
        local_90.m_data._0_8_ = *(undefined8 *)((Vec4 *)(pVVar7 + -4))->m_data;
        local_a0.m_data[2] = *(float *)((long)(pVVar7 + -1) + 4);
        local_a0.m_data._0_8_ = *(undefined8 *)((long)(pVVar7 + -2) + 8);
        fVar19 = pVVar7[1].m_data[0];
        advblend::setLum(local_60,&local_90,&local_a0);
        tcu::operator*(local_54,fVar19,(Vector<float,_3> *)local_60);
        tcu::operator+((tcu *)&local_84,(Vector<float,_3> *)local_54,pVVar7);
        *(float *)((long)(pVVar7 + 3) + 4) = local_7c;
        *(undefined8 *)((long)(pVVar7 + 2) + 8) = local_84;
      }
      pVVar7 = pVVar7 + 0xb;
    }
    break;
  case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:
    pVVar7 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar6 = 0x40;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      if (*(char *)(pVVar7[-5].m_data + 2) == '\x01') {
        local_90.m_data[2] = ((Vec4 *)(pVVar7 + -4))->m_data[2];
        local_90.m_data._0_8_ = *(undefined8 *)((Vec4 *)(pVVar7 + -4))->m_data;
        local_a0.m_data[2] = *(float *)((long)(pVVar7 + -1) + 4);
        local_a0.m_data._0_8_ = *(undefined8 *)((long)(pVVar7 + -2) + 8);
        fVar19 = pVVar7[1].m_data[0];
        advblend::setLum(local_60,&local_a0,&local_90);
        tcu::operator*(local_54,fVar19,(Vector<float,_3> *)local_60);
        tcu::operator+((tcu *)&local_84,(Vector<float,_3> *)local_54,pVVar7);
        *(float *)((long)(pVVar7 + 3) + 4) = local_7c;
        *(undefined8 *)((long)(pVVar7 + 2) + 8) = local_84;
      }
      pVVar7 = pVVar7 + 0xb;
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeAdvancedBlend (BlendEquationAdvanced equation)
{
	using namespace advblend;

#define SAMPLE_REGISTER_ADV_BLEND(FUNCTION_NAME)											\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;							\
			const Vec4&	dstColor	= sample.clampedBlendDstColor;							\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
			const float	r			= FUNCTION_NAME(srcColor[0], dstColor[0])*p0 + bias[0];	\
			const float	g			= FUNCTION_NAME(srcColor[1], dstColor[1])*p0 + bias[1];	\
			const float	b			= FUNCTION_NAME(srcColor[2], dstColor[2])*p0 + bias[2];	\
																							\
			sample.blendedRGB = Vec3(r, g, b);												\
		}																					\
	}

#define SAMPLE_REGISTER_ADV_BLEND_HSL(COLOR_EXPRESSION)										\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec3	srcColor	= sample.clampedBlendSrcColor.swizzle(0,1,2);			\
			const Vec3	dstColor	= sample.clampedBlendDstColor.swizzle(0,1,2);			\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
																							\
			sample.blendedRGB = (COLOR_EXPRESSION)*p0 + bias;								\
		}																					\
	}

	// Pre-compute factors & compute alpha \todo [2014-03-18 pyry] Re-using variable names.
	// \note clampedBlend*Color contains clamped & unpremultiplied colors
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			SampleData&	sample		= m_sampleRegister[regSampleNdx];
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;
			const Vec4&	dstColor	= sample.clampedBlendDstColor;
			const float	srcA		= srcColor.w();
			const float	dstA		= dstColor.w();
			const float	p0			= srcA*dstA;
			const float p1			= srcA*(1.0f-dstA);
			const float p2			= dstA*(1.0f-srcA);
			const Vec3	bias		(srcColor[0]*p1 + dstColor[0]*p2,
									 srcColor[1]*p1 + dstColor[1]*p2,
									 srcColor[2]*p1 + dstColor[2]*p2);

			sample.blendSrcFactorRGB	= bias;
			sample.blendSrcFactorA		= p0;
			sample.blendedA				= p0 + p1 + p2;
		}
	}

	switch (equation)
	{
		case BLENDEQUATION_ADVANCED_MULTIPLY:		SAMPLE_REGISTER_ADV_BLEND(multiply);									break;
		case BLENDEQUATION_ADVANCED_SCREEN:			SAMPLE_REGISTER_ADV_BLEND(screen);										break;
		case BLENDEQUATION_ADVANCED_OVERLAY:		SAMPLE_REGISTER_ADV_BLEND(overlay);										break;
		case BLENDEQUATION_ADVANCED_DARKEN:			SAMPLE_REGISTER_ADV_BLEND(darken);										break;
		case BLENDEQUATION_ADVANCED_LIGHTEN:		SAMPLE_REGISTER_ADV_BLEND(lighten);										break;
		case BLENDEQUATION_ADVANCED_COLORDODGE:		SAMPLE_REGISTER_ADV_BLEND(colordodge);									break;
		case BLENDEQUATION_ADVANCED_COLORBURN:		SAMPLE_REGISTER_ADV_BLEND(colorburn);									break;
		case BLENDEQUATION_ADVANCED_HARDLIGHT:		SAMPLE_REGISTER_ADV_BLEND(hardlight);									break;
		case BLENDEQUATION_ADVANCED_SOFTLIGHT:		SAMPLE_REGISTER_ADV_BLEND(softlight);									break;
		case BLENDEQUATION_ADVANCED_DIFFERENCE:		SAMPLE_REGISTER_ADV_BLEND(difference);									break;
		case BLENDEQUATION_ADVANCED_EXCLUSION:		SAMPLE_REGISTER_ADV_BLEND(exclusion);									break;
		case BLENDEQUATION_ADVANCED_HSL_HUE:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(srcColor, dstColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_SATURATION:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(dstColor, srcColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_COLOR:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(srcColor, dstColor));				break;
		case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(dstColor, srcColor));				break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_ADV_BLEND
#undef SAMPLE_REGISTER_ADV_BLEND_HSL
}